

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c
# Opt level: O2

LispPTR rpc(LispPTR *args)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  hostent *phVar4;
  LispPTR *pLVar5;
  size_t sVar6;
  int *piVar7;
  ulong uVar8;
  ssize_t sVar9;
  long lVar10;
  DLword *pDVar11;
  LispPTR LVar12;
  long lVar13;
  LispPTR LVar14;
  LispPTR LVar15;
  ulong uVar16;
  uint uVar17;
  int dest;
  hostent *local_180;
  ulong local_178;
  ulong local_170;
  DLword *local_168;
  int local_160;
  uint fromlen;
  timeval pertry_timeout;
  sockaddr_in sin1;
  sockaddr_in sin;
  sockaddr_in from;
  char hostname [100];
  fd_set read_descriptors;
  
  uVar17 = *args;
  dest = *(ushort *)((ulong)(uVar17 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  if ((ushort)((short)dest - 1U) < 2) {
    if ((uVar17 & 0xfff0000) == 0xf0000) {
      dest = uVar17 | 0xffff0000;
    }
    else if ((uVar17 & 0xfff0000) == 0xe0000) {
      dest = uVar17 & 0xffff;
    }
    else {
      if ((short)dest != 2) {
        return 0;
      }
      pLVar5 = NativeAligned4FromLAddr(uVar17);
      dest = *pLVar5;
    }
    phVar4 = gethostbyaddr(&dest,4,2);
  }
  else {
    pLVar5 = NativeAligned4FromLAddr(uVar17);
    LVar14 = 100;
    if ((int)pLVar5[2] < 100) {
      LVar14 = pLVar5[2];
    }
    lVar10 = (long)(int)LVar14;
    if (*(char *)((long)pLVar5 + 6) == 'D') {
      pDVar11 = Lisp_world + (ulong)(ushort)pLVar5[1] + (ulong)(*pLVar5 & 0xfffffff);
      for (lVar13 = 0; lVar10 != lVar13; lVar13 = lVar13 + 1) {
        hostname[lVar13] = *(char *)((ulong)pDVar11 ^ 2);
        pDVar11 = pDVar11 + 1;
      }
      hostname[lVar13] = '\0';
    }
    else if (*(char *)((long)pLVar5 + 6) == 'C') {
      uVar17 = *pLVar5;
      LVar14 = pLVar5[1];
      for (lVar13 = 0; lVar10 != lVar13; lVar13 = lVar13 + 1) {
        hostname[lVar13] =
             *(char *)((long)Lisp_world +
                       lVar13 + (ulong)(ushort)LVar14 + (ulong)(uVar17 & 0xfffffff) * 2 ^ 3);
      }
      hostname[lVar10] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    phVar4 = gethostbyname(hostname);
  }
  uVar17 = args[1];
  if ((uVar17 & 0xfff0000 | 0x10000) != 0xf0000) {
    if ((*(ushort *)((ulong)(uVar17 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    pLVar5 = NativeAligned4FromLAddr(uVar17);
    uVar17 = *pLVar5;
  }
  local_170 = (ulong)args[2];
  local_178 = (ulong)args[3];
  local_168 = Lisp_world;
  uVar1 = args[4];
  if ((uVar1 & 0xfff0000) == 0xf0000) {
    LVar14 = uVar1 | 0xffff0000;
  }
  else if ((uVar1 & 0xfff0000) == 0xe0000) {
    LVar14 = uVar1 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar1 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    pLVar5 = NativeAligned4FromLAddr(uVar1);
    LVar14 = *pLVar5;
  }
  uVar1 = args[5];
  local_180 = phVar4;
  if ((uVar1 & 0xfff0000) == 0xf0000) {
    LVar12 = uVar1 | 0xffff0000;
  }
  else if ((uVar1 & 0xfff0000) == 0xe0000) {
    LVar12 = uVar1 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar1 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    pLVar5 = NativeAligned4FromLAddr(uVar1);
    LVar12 = *pLVar5;
  }
  uVar1 = args[6];
  if ((uVar1 & 0xfff0000) == 0xf0000) {
    LVar15 = uVar1 | 0xffff0000;
  }
  else if ((uVar1 & 0xfff0000) == 0xe0000) {
    LVar15 = uVar1 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar1 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    pLVar5 = NativeAligned4FromLAddr(uVar1);
    LVar15 = *pLVar5;
  }
  local_160 = (int)(LVar14 * 1000) % 1000000;
  pertry_timeout.tv_sec = (__time_t)((int)LVar12 / 1000);
  pertry_timeout.tv_usec = (__suseconds_t)((int)(LVar12 * 1000) % 1000000);
  uVar1 = socket(2,2,0);
  if ((int)uVar1 < 0) {
    return 0;
  }
  uVar2 = fcntl(uVar1,3,0);
  fcntl(uVar1,4,(ulong)(uVar2 | 0x800));
  sin.sin_zero[0] = '\0';
  sin.sin_zero[1] = '\0';
  sin.sin_zero[2] = '\0';
  sin.sin_zero[3] = '\0';
  sin.sin_zero[4] = '\0';
  sin.sin_zero[5] = '\0';
  sin.sin_zero[6] = '\0';
  sin.sin_zero[7] = '\0';
  sin.sin_family = 2;
  sin.sin_port = 0;
  sin.sin_addr.s_addr = 0;
  bind(uVar1,(sockaddr *)&sin,0x10);
  if (local_180 == (hostent *)0x0) {
    return 0;
  }
  pDVar11 = local_168 + local_170;
  sin1.sin_family = (sa_family_t)local_180->h_addrtype;
  memcpy(&sin1.sin_addr,*local_180->h_addr_list,(long)local_180->h_length);
  sin1.sin_port = (ushort)uVar17 << 8 | (ushort)uVar17 >> 8;
  sVar6 = sendto(uVar1,pDVar11,(long)(int)LVar15,0,(sockaddr *)&sin1,0x10);
  if (sVar6 == (long)(int)LVar15) {
    pDVar11 = local_168 + local_178;
    local_170 = (ulong)((int)LVar14 / 1000);
    uVar16 = 1L << ((byte)uVar1 & 0x3f);
    local_178 = (ulong)local_160;
    local_168 = (DLword *)0x0;
    local_180 = (hostent *)0x0;
    do {
      do {
        while( true ) {
          read_descriptors.__fds_bits[uVar1 >> 6] = read_descriptors.__fds_bits[uVar1 >> 6] | uVar16
          ;
          iVar3 = select(0x20,(fd_set *)&read_descriptors,(fd_set *)0x0,(fd_set *)0x0,
                         (timeval *)&pertry_timeout);
          if (iVar3 != -1) break;
          piVar7 = __errno_location();
          if (*piVar7 != 4) {
            return 0;
          }
        }
        if (iVar3 == 0) {
          lVar13 = (long)local_168 + pertry_timeout.tv_usec;
          lVar10 = 999999;
          if (lVar13 < 999999) {
            lVar10 = lVar13;
          }
          uVar8 = ((lVar13 - lVar10) + 999999U) / 1000000;
          local_180 = (hostent *)((long)local_180 + pertry_timeout.tv_sec + uVar8);
          if ((long)local_170 < (long)local_180) {
            return 0;
          }
          local_168 = (DLword *)(lVar13 + uVar8 * -1000000);
          if ((local_180 == (hostent *)local_170) && ((long)local_178 <= (long)local_168)) {
            return 0;
          }
        }
      } while ((read_descriptors.__fds_bits[uVar1 >> 6] & uVar16) == 0);
      do {
        fromlen = 0x10;
        sVar9 = recvfrom(uVar1,pDVar11,1000,0,(sockaddr *)&from,&fromlen);
        if (-1 < (int)sVar9) {
          close(uVar1);
          return 0x4c;
        }
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
    } while (*piVar7 == 0xb);
    return 0;
  }
  return 0;
}

Assistant:

LispPTR rpc(LispPTR *args)
{
#ifndef DOS
  /* Arguments are:
     args[0]:Destination Address; hostname or internet address are both supported.
     args[1]:Remote port for this program.
     args[2]:Argument block pointer.
     args[3]:Result Block pointer.
     args[4]:Milliseconds before timeout
     args[5]:Milliseconds between tries
     args[6]:Argument block length
     */
  char hostname[MAX_HOSTNAME_LENGTH];
  struct hostent *hp;
  struct sockaddr_in sin, sin1, from;
  char *outbuf, *inbuf, *destaddr;
  int s, msec_until_timeout, msec_between_tries, out_length;
  int received;
  int port;
  int dest;
  unsigned fromlen;
  fd_set read_descriptors;
  struct timeval pertry_timeout, total_timeout, time_waited;

  /* Set timeout */
  /* CONVERT FROM LISP TO C TYPES */
  dest = GetTypeNumber(args[0]);

  if ((dest == TYPE_FIXP) || (dest == TYPE_SMALLP)) {
    N_GETNUMBER(args[0], dest, handle_error);
    destaddr = (char *)&dest;
    hp = gethostbyaddr(destaddr, sizeof(struct in_addr), AF_INET);
  } else {
    /* Convert Hostname */
    LispStringToCString(args[0], hostname, MAX_HOSTNAME_LENGTH);
    hp = gethostbyname(hostname);
  }

  N_GETNUMBER(args[1], port, handle_error);

  /* Translate the buffer pointer into C pointers */
  outbuf = (char *)(NativeAligned2FromLAddr(args[2]));
  inbuf = (char *)(NativeAligned2FromLAddr(args[3]));

  N_GETNUMBER(args[4], msec_until_timeout, handle_error);

  N_GETNUMBER(args[5], msec_between_tries, handle_error);

  N_GETNUMBER(args[6], out_length, handle_error);

  /* Convert to micro seconds */
  msec_until_timeout = msec_until_timeout * 1000;
  msec_between_tries = msec_between_tries * 1000;

  /* Set up the timeouts */
  total_timeout.tv_sec = msec_until_timeout / 1000000;
  total_timeout.tv_usec = msec_until_timeout % 1000000;
  pertry_timeout.tv_sec = msec_between_tries / 1000000;
  pertry_timeout.tv_usec = msec_between_tries % 1000000;

  /* SET UP THE SOCKET */

  /* Open the socket; Might want to make this non-blocking */
  if ((s = socket(AF_INET, SOCK_DGRAM, 0)) < 0) goto handle_error;

  /* The sockets that rpc controls don't block */
  fcntl(s, F_SETFL, fcntl(s, F_GETFL, 0) | O_NONBLOCK);

  memset((char *)&sin, 0, sizeof(sin));
  sin.sin_family = AF_INET;
  bind(s, (struct sockaddr *)&sin, sizeof(sin));

  /* Resolve the host address. */
  if (hp) {
    sin1.sin_family = hp->h_addrtype;
    memcpy(&sin1.sin_addr, hp->h_addr, hp->h_length);
  } else
    goto handle_error;

  /* Convert to network byte order */
  sin1.sin_port = htons((u_short)port);

  /* Send buffer out on the socket */
  if (sendto(s, outbuf, out_length, 0, (struct sockaddr *)&sin1, sizeof(sin1)) != out_length)
    goto handle_error;

  /* Set up the timers */
  time_waited.tv_sec = 0;
  time_waited.tv_usec = 0;

/* Start the waiting loop */
receive:

  /* Set the select mask */
  FD_SET(s, &read_descriptors);

  switch (
      select(32, &read_descriptors, NULL, NULL, &pertry_timeout)) {
    /* Per try timeout expired, Check the total timeout */
    case 0:
      time_waited.tv_sec += pertry_timeout.tv_sec;
      time_waited.tv_usec += pertry_timeout.tv_usec;
      while (time_waited.tv_usec >= 1000000) {
        time_waited.tv_sec++;
        time_waited.tv_usec -= 1000000;
      }
      /* If the time waited is greater than the total
       * timeout then there's an error
       */
      if ((time_waited.tv_sec > total_timeout.tv_sec) ||
          ((time_waited.tv_sec == total_timeout.tv_sec) &&
           (time_waited.tv_usec >= total_timeout.tv_usec)))
        goto handle_error;
      else
        break;

    /* An error was generated, Unless it was a system error stop */
    case -1:
      if (errno == EINTR)
        goto receive;
      else
        goto handle_error;
  }
  /* Nothing arrived for this socket, try again */
  if (!FD_ISSET(s, &read_descriptors)) goto receive;

/* Something arrived; try to get it */

getbuf:
  fromlen = sizeof(struct sockaddr);
  received = recvfrom(s, inbuf, UDP_DATA_BLOCK_SIZE, 0, (struct sockaddr *)&from, &fromlen);
  if (received < 0) switch (errno) {
      case EINTR: goto getbuf;
      case EWOULDBLOCK: goto receive;
      default: goto handle_error;
    }

  /* close the socket */
  close(s);

  /* Return TRUE */
  return (ATOM_T);

/* Return NIL; Eventually we will need to return something more informative, perhaps errno
 * would be sufficient.
 */
handle_error:
  return (NIL_PTR);
#endif /* DOS */
}